

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O1

String * __thiscall
doctest::toString<double>(String *__return_storage_ptr__,doctest *this,IsNaN<double> in)

{
  char *__dest;
  uint sz;
  char *pcVar1;
  anon_union_24_2_13149d16_for_String_3 local_a8;
  anon_union_24_2_13149d16_for_String_3 local_90;
  anon_union_24_2_13149d16_for_String_3 local_78;
  anon_union_24_2_13149d16_for_String_3 local_60;
  anon_union_24_2_13149d16_for_String_3 local_48;
  anon_union_24_2_13149d16_for_String_3 local_30;
  
  pcVar1 = "";
  if (((ulong)this & 1) != 0) {
    pcVar1 = "! ";
  }
  sz = (int)this * 2 & 2;
  __dest = String::allocate((String *)&local_60.data,sz);
  memcpy(__dest,pcVar1,(ulong)sz);
  pcVar1 = String::allocate((String *)&local_78.data,7);
  builtin_strncpy(pcVar1,"IsNaN( ",7);
  operator+((String *)&local_48.data,(String *)&local_60.data,(String *)&local_78.data);
  detail::tlssPush();
  std::ostream::_M_insert<double>(in.value);
  detail::tlssPop();
  operator+((String *)&local_30.data,(String *)&local_48.data,(String *)&local_90.data);
  pcVar1 = String::allocate((String *)&local_a8.data,2);
  pcVar1[0] = ' ';
  pcVar1[1] = ')';
  operator+(__return_storage_ptr__,(String *)&local_30.data,(String *)&local_a8.data);
  if ((local_a8.buf[0x17] < '\0') && (local_a8.data.ptr != (char *)0x0)) {
    operator_delete__(local_a8.data.ptr);
  }
  if ((local_30.buf[0x17] < '\0') && (local_30.data.ptr != (char *)0x0)) {
    operator_delete__(local_30.data.ptr);
  }
  if ((local_90.buf[0x17] < '\0') && (local_90.data.ptr != (char *)0x0)) {
    operator_delete__(local_90.data.ptr);
  }
  if ((local_48.buf[0x17] < '\0') && (local_48.data.ptr != (char *)0x0)) {
    operator_delete__(local_48.data.ptr);
  }
  if ((local_78.buf[0x17] < '\0') && (local_78.data.ptr != (char *)0x0)) {
    operator_delete__(local_78.data.ptr);
  }
  if ((local_60.buf[0x17] < '\0') && (local_60.data.ptr != (char *)0x0)) {
    operator_delete__(local_60.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String toString(IsNaN<F> in) { return String(in.flipped ? "! " : "") + "IsNaN( " + doctest::toString(in.value) + " )"; }